

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O1

bool __thiscall
glcts::TessellationShaderMaxPatchVertices::compareResults
          (TessellationShaderMaxPatchVertices *this,char *description,GLint *ref_iv)

{
  ulong uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  int *piVar5;
  ulong uVar6;
  size_t sVar7;
  bool bVar8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  bVar8 = false;
  piVar5 = (int *)(**(code **)(lVar4 + 0xd00))(0x8c8e,0,0x20,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glMapBufferRange(ints) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x2c9);
  if (*piVar5 == *ref_iv) {
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      bVar8 = 2 < uVar6;
      if (uVar6 == 3) goto LAB_00d42b00;
      uVar1 = uVar6 + 1;
    } while (piVar5[uVar6 + 1] == ref_iv[uVar6 + 1]);
    bVar8 = 2 < uVar6;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
  local_1b0 = (undefined1  [8])
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (description == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
  }
  else {
    sVar7 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,description,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," captured results ivec4(",0x18);
  std::ostream::operator<<((ostringstream *)&local_1a8,*piVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::operator<<((ostringstream *)&local_1a8,piVar5[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::operator<<((ostringstream *)&local_1a8,piVar5[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::operator<<((ostringstream *)&local_1a8,piVar5[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"are different from the expected values ivec4(",0x2d);
  std::ostream::operator<<((ostringstream *)&local_1a8,*ref_iv);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::operator<<((ostringstream *)&local_1a8,ref_iv[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::operator<<((ostringstream *)&local_1a8,ref_iv[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::operator<<((ostringstream *)&local_1a8,ref_iv[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,").",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_00d42b00:
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glUnmapBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x2df);
  return bVar8;
}

Assistant:

bool TessellationShaderMaxPatchVertices::compareResults(const char* description, glw::GLint ref_iv[4])
{
	/* Retrieve ES entry/state points. */
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	const glw::GLint*	 resultInts = DE_NULL;

	resultInts = (const glw::GLint*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0,
		(sizeof(glw::GLint) /* GLfloat size */ * 4 /* components */ * OUTPUT_VERTEX_COUNT), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange(ints) failed");

	bool test_failed = false;

	/* Comparison of ivec4. */
	for (int i = 0; i < 4 /* components */; i++)
	{
		if (resultInts[i] != ref_iv[i])
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

			m_testCtx.getLog() << tcu::TestLog::Message << description << " captured results ivec4(" << resultInts[0]
							   << ", " << resultInts[1] << ", " << resultInts[2] << ", " << resultInts[3] << ") "
							   << "are different from the expected values ivec4(" << ref_iv[0] << ", " << ref_iv[1]
							   << ", " << ref_iv[2] << ", " << ref_iv[3] << ")." << tcu::TestLog::EndMessage;

			test_failed = true;
			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed!");

	return !test_failed;
}